

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O1

string * __thiscall
duckdb_re2::Regexp::ToString_abi_cxx11_(string *__return_storage_ptr__,Regexp *this)

{
  ToStringWalker w;
  Walker<int> local_80;
  string *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80._vptr_Walker = (_func_int **)&PTR__Walker_005d3130;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_80.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::
  _M_initialize_map((_Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                     *)&local_80.stack_,0);
  local_80.stopped_early_ = false;
  local_80._vptr_Walker = (_func_int **)&PTR__Walker_005d3b60;
  local_80.max_visits_ = 100000;
  local_20 = __return_storage_ptr__;
  Walker<int>::WalkInternal(&local_80,this,6,false);
  if (local_80.stopped_early_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  Walker<int>::~Walker(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string Regexp::ToString() {
  std::string t;
  ToStringWalker w(&t);
  w.WalkExponential(this, PrecToplevel, 100000);
  if (w.stopped_early())
    t += " [truncated]";
  return t;
}